

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_4::Repairer::Run(Repairer *this)

{
  Logger *info_log;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 uVar4;
  Repairer *in_RSI;
  ulong local_48;
  size_t i;
  unsigned_long_long bytes;
  undefined1 local_19;
  Repairer *this_local;
  Status *status;
  
  local_19 = 0;
  this_local = this;
  FindFiles(this);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    ConvertLogFilesToTables(in_RSI);
    ExtractMetaData(in_RSI);
    WriteDescriptor((Repairer *)&bytes);
    Status::operator=((Status *)this,(Status *)&bytes);
    Status::~Status((Status *)&bytes);
  }
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    i = 0;
    for (local_48 = 0;
        sVar2 = std::
                vector<leveldb::(anonymous_namespace)::Repairer::TableInfo,_std::allocator<leveldb::(anonymous_namespace)::Repairer::TableInfo>_>
                ::size(&in_RSI->tables_), local_48 < sVar2; local_48 = local_48 + 1) {
      pvVar3 = std::
               vector<leveldb::(anonymous_namespace)::Repairer::TableInfo,_std::allocator<leveldb::(anonymous_namespace)::Repairer::TableInfo>_>
               ::operator[](&in_RSI->tables_,local_48);
      i = (pvVar3->meta).file_size + i;
    }
    info_log = (in_RSI->options_).info_log;
    uVar4 = std::__cxx11::string::c_str();
    sVar2 = std::
            vector<leveldb::(anonymous_namespace)::Repairer::TableInfo,_std::allocator<leveldb::(anonymous_namespace)::Repairer::TableInfo>_>
            ::size(&in_RSI->tables_);
    Log(info_log,
        "**** Repaired leveldb %s; recovered %d files; %llu bytes. Some data may have been lost. ****"
        ,uVar4,sVar2 & 0xffffffff,i);
  }
  return (Status)(char *)this;
}

Assistant:

Status Run() {
    Status status = FindFiles();
    if (status.ok()) {
      ConvertLogFilesToTables();
      ExtractMetaData();
      status = WriteDescriptor();
    }
    if (status.ok()) {
      unsigned long long bytes = 0;
      for (size_t i = 0; i < tables_.size(); i++) {
        bytes += tables_[i].meta.file_size;
      }
      Log(options_.info_log,
          "**** Repaired leveldb %s; "
          "recovered %d files; %llu bytes. "
          "Some data may have been lost. "
          "****",
          dbname_.c_str(), static_cast<int>(tables_.size()), bytes);
    }
    return status;
  }